

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

Array<asl::File> __thiscall asl::Directory::items(Directory *this,String *which,ItemType t)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  char *__file;
  int in_ECX;
  undefined4 in_register_00000014;
  String *this_00;
  byte local_1c1;
  bool local_1b2;
  char *local_1b0;
  FileInfo local_190;
  File local_170;
  byte local_121;
  String local_120;
  undefined1 local_108 [8];
  stat data;
  dirent *entry;
  bool wildcard;
  undefined1 local_60 [8];
  String name;
  String dir;
  DIR *d;
  ItemType t_local;
  String *which_local;
  Directory *this_local;
  
  this_00 = (String *)CONCAT44(in_register_00000014,t);
  Array<asl::File>::clear((Array<asl::File> *)(which + 1));
  bVar1 = asl::String::operator!=(which,"");
  if (bVar1) {
    local_1b0 = asl::String::operator*(which);
  }
  else {
    local_1b0 = "/";
  }
  __dirp = opendir(local_1b0);
  if (__dirp == (DIR *)0x0) {
    Array<asl::File>::Array((Array<asl::File> *)this,(Array<asl::File> *)(which + 1));
  }
  else {
    bVar1 = asl::String::endsWith(which,'/');
    if (bVar1) {
      asl::String::String((String *)((long)&name.field_2 + 8),which);
    }
    else {
      asl::String::operator+((String *)((long)&name.field_2 + 8),which,'/');
    }
    asl::String::String((String *)local_60);
    bVar1 = asl::String::contains(this_00,'*');
    local_1b2 = false;
    if (bVar1) {
      local_1b2 = asl::String::operator!=(this_00,"*");
    }
    while (data.__glibc_reserved[2] = (__syscall_slong_t)readdir(__dirp),
          (dirent *)data.__glibc_reserved[2] != (dirent *)0x0) {
      local_121 = 0;
      local_1c1 = 0;
      if (local_1b2 != false) {
        asl::String::String(&local_120,((dirent *)data.__glibc_reserved[2])->d_name);
        local_121 = 1;
        bVar1 = match(&local_120,this_00);
        local_1c1 = bVar1 ^ 0xff;
      }
      if ((local_121 & 1) != 0) {
        asl::String::~String(&local_120);
      }
      if ((((local_1c1 & 1) == 0) &&
          (iVar2 = strcmp((char *)(data.__glibc_reserved[2] + 0x13),"."), iVar2 != 0)) &&
         (iVar2 = strcmp((char *)(data.__glibc_reserved[2] + 0x13),".."), iVar2 != 0)) {
        asl::String::operator=((String *)local_60,(String *)((long)&name.field_2 + 8));
        asl::String::operator+=((String *)local_60,(char *)(data.__glibc_reserved[2] + 0x13));
        __file = asl::String::operator_cast_to_char_((String *)local_60);
        iVar2 = stat(__file,(stat *)local_108);
        if (((iVar2 == 0) && ((in_ECX != 1 || (((uint)data.st_nlink & 0xf000) == 0x4000)))) &&
           ((in_ECX != 0 || (((uint)data.st_nlink & 0xf000) != 0x4000)))) {
          infoFor(&local_190,(stat *)local_108);
          File::File(&local_170,(String *)local_60,&local_190);
          Array<asl::File>::operator<<((Array<asl::File> *)(which + 1),&local_170);
          File::~File(&local_170);
        }
      }
    }
    closedir(__dirp);
    Array<asl::File>::Array((Array<asl::File> *)this,(Array<asl::File> *)(which + 1));
    asl::String::~String((String *)local_60);
    asl::String::~String((String *)((long)&name.field_2 + 8));
  }
  return (Array<asl::File>)(File *)this;
}

Assistant:

Array<File> Directory::items(const String& which, Directory::ItemType t)
{
	_files.clear();
	DIR* d = opendir(_path != ""? *_path : "/");
	if(!d)
		return _files;
	String dir = _path.endsWith('/')? _path : (_path+'/');
	String name;
	bool wildcard = which.contains('*') && which != "*";
	
	while(dirent* entry=readdir(d))
	{
		struct stat data;
		if(wildcard && !match(entry->d_name, which))
			continue;
		if(!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
			continue;
		name = dir;
		name += (const char*)entry->d_name;
		if(!stat(name, &data)) {
			if( (t==DIRE && !S_ISDIR(data.st_mode)) ||
				(t==FILE && S_ISDIR(data.st_mode)) )
				continue;
			_files << File(name, infoFor(data));
		}
	}
	closedir(d);
	return _files;
}